

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O3

int main(void)

{
  test_buffer();
  basic_io();
  get_set_srv();
  test_async_connect();
  test_async_connect_fail();
  test_unix();
  test_ipv6();
  test_pair();
  test_async_send_recv();
  test_cancel_operations();
  test_full_read_write();
  test_full_async_read_write();
  test_close();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	try {
		test_buffer();
		basic_io();
		readv_writev();
		get_set_srv();
		test_async_connect();
		test_async_connect_fail();
		test_unix();
		test_ipv6();
		test_pair();
		test_async_send_recv();
		test_cancel_operations();
		test_full_read_write();
		test_full_async_read_write();
		test_close();
	}

	catch(std::exception const &e)
	{
		std::cout<<"Failed:"<< e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}